

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O0

void __thiscall QErrorMessage::done(QErrorMessage *this,int a)

{
  long lVar1;
  bool bVar2;
  QErrorMessagePrivate *this_00;
  QErrorMessagePrivate *in_RDI;
  long in_FS_OFFSET;
  QErrorMessagePrivate *d;
  QErrorMessagePrivate *this_01;
  QDialog *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QErrorMessage *)0x74876d);
  bVar2 = QAbstractButton::isChecked((QAbstractButton *)this_00);
  if (!bVar2) {
    bVar2 = QString::isEmpty((QString *)0x748798);
    if (bVar2) {
      bVar2 = QString::isEmpty((QString *)0x7487af);
      if (!bVar2) {
        QSet<QString>::insert((QSet<QString> *)in_stack_ffffffffffffffd8,(QString *)this_01);
      }
    }
    else {
      QSet<QString>::insert((QSet<QString> *)in_stack_ffffffffffffffd8,(QString *)this_01);
    }
  }
  QString::clear((QString *)this_00);
  QString::clear((QString *)this_00);
  QDialog::done(in_stack_ffffffffffffffd8,(int)((ulong)this_01 >> 0x20));
  bVar2 = QErrorMessagePrivate::nextPending(this_01);
  if (bVar2) {
    QWidget::show((QWidget *)this_01);
  }
  else if ((in_RDI == (QErrorMessagePrivate *)qtMessageHandler) && ((metFatal & 1U) != 0)) {
    exit(1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QErrorMessage::done(int a)
{
    Q_D(QErrorMessage);
    if (!d->again->isChecked()) {
        if (d->currentType.isEmpty()) {
            if (!d->currentMessage.isEmpty())
                d->doNotShow.insert(d->currentMessage);
        } else {
            d->doNotShowType.insert(d->currentType);
        }
    }
    d->currentMessage.clear();
    d->currentType.clear();

    QDialog::done(a);

    if (d->nextPending()) {
        show();
    } else {
        if (this == qtMessageHandler && metFatal)
            exit(1);
    }
}